

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void xclass_cb(Fl_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  Fl_Group *pFVar3;
  char *n;
  Fl_Widget_Type *w;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Input *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar2 == 0) {
      (*(i->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[6])();
      pFVar3 = Fl_Widget::parent((Fl_Widget *)i);
      (*(pFVar3->super_Fl_Widget)._vptr_Fl_Widget[6])();
    }
    else {
      (*(i->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[5])();
      pFVar3 = Fl_Widget::parent((Fl_Widget *)i);
      (*(pFVar3->super_Fl_Widget)._vptr_Fl_Widget[5])();
      Fl_Input_::value(&i->super_Fl_Input_,current_widget->xclass);
    }
  }
  else {
    bVar1 = false;
    for (w = (Fl_Widget_Type *)Fl_Type::first; w != (Fl_Widget_Type *)0x0;
        w = (Fl_Widget_Type *)(w->super_Fl_Type).next) {
      if (((w->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        bVar1 = true;
        iVar2 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x21])();
        if ((iVar2 != 0) || (iVar2 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x18])(), iVar2 != 0)) {
          n = Fl_Input_::value(&i->super_Fl_Input_);
          storestring(n,&w->xclass,0);
        }
        iVar2 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x21])();
        if (iVar2 == 0) {
          iVar2 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x1e])();
          if (iVar2 != 0) {
            Fl_Widget_Type::redraw(w);
          }
        }
        else {
          Fl_Window::xclass((Fl_Window *)w->o,w->xclass);
        }
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void xclass_cb(Fl_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {
      i->hide(); 
      i->parent()->hide(); // hides the "X Class:" label as well
      return;
    }
    i->show();
    i->parent()->show();
    i->value(((Fl_Widget_Type *)current_widget)->xclass);
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        mod = 1;
	Fl_Widget_Type* w = (Fl_Widget_Type*)o;
	if (w->is_window() || w->is_button())
	  storestring(i->value(),w->xclass);
	if (w->is_window()) ((Fl_Window*)(w->o))->xclass(w->xclass);
	else if (w->is_menu_item()) w->redraw();
      }
    }
    if (mod) set_modflag(1);
  }
}